

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall cs::statement_function::set_mem_fn(statement_function *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"this",&local_31);
  cs::function::add_reserve_var(&this->mFunc,&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  this->mIsMemFn = true;
  return;
}

Assistant:

void set_mem_fn()
		{
			mFunc.add_reserve_var("this", true);
			mIsMemFn = true;
		}